

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::emit_wave_builtin_instruction(BuiltIn builtin,Impl *impl,CallInst *instruction)

{
  uint value;
  Id IVar1;
  Builder *this;
  Operation *this_00;
  
  if ((builtin == BuiltInSubgroupSize) && ((impl->options).force_subgroup_size != 0)) {
    this = Converter::Impl::builder(impl);
    value = (impl->options).force_subgroup_size;
    IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar1 = spv::Builder::makeIntConstant(this,IVar1,value,false);
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar1);
  }
  else {
    IVar1 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,builtin);
    this_00 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
    Operation::add_id(this_00,IVar1);
    Converter::Impl::add(impl,this_00,false);
  }
  return true;
}

Assistant:

bool emit_wave_builtin_instruction(spv::BuiltIn builtin, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.options.force_subgroup_size && builtin == spv::BuiltInSubgroupSize)
	{
		impl.rewrite_value(instruction, impl.builder().makeUintConstant(impl.options.force_subgroup_size));
		return true;
	}

	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(builtin);
	auto *op = impl.allocate(spv::OpLoad, instruction);
	op->add_id(var_id);

	impl.add(op);
	return true;
}